

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase755::run(TestCase755 *this)

{
  char *pcVar1;
  size_t sVar2;
  ReadableFile *pRVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  String *pSVar7;
  String *ptrCopy;
  bool bVar8;
  StringPtr name;
  StringPtr name_00;
  PathPtr path;
  StringPtr text;
  StringPtr name_01;
  PathPtr path_00;
  ArrayPtr<const_kj::StringPtr> parts;
  StringPtr name_02;
  PathPtr path_01;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_02;
  StringPtr name_03;
  StringPtr name_04;
  PathPtr path_03;
  StringPtr text_00;
  ArrayPtr<const_kj::StringPtr> parts_01;
  PathPtr path_04;
  ArrayPtr<const_kj::StringPtr> parts_02;
  StringPtr name_05;
  StringPtr name_06;
  PathPtr path_05;
  StringPtr text_01;
  ArrayPtr<const_kj::StringPtr> parts_03;
  ArrayPtr<const_kj::StringPtr> parts_04;
  PathPtr path_06;
  DebugExpression<bool> _kjCondition_1;
  bool _kjCondition_4;
  DebugComparison<kj::String,_const_char_(&)[9]> _kjCondition;
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> replacer;
  Own<kj::Directory,_std::nullptr_t> dir;
  TempDir tempDir;
  String local_138;
  Path local_118;
  undefined8 local_100;
  String local_f8;
  DebugComparison<kj::String,_const_char_(&)[9]> local_d8;
  FsNode local_98;
  ReadableFile *local_90;
  Path local_88;
  TempDir local_68;
  ReadableFile *local_50;
  TempDir local_48;
  
  TempDir::TempDir(&local_48);
  TempDir::get(&local_68);
  sVar2 = local_68.filename.content.size_;
  name.content.size_ = 4;
  name.content.ptr = "foo";
  Path::Path((Path *)&local_d8,name);
  (**(code **)(((Array<char> *)sVar2)->ptr + 0x90))
            (&local_98,sVar2,local_d8.left.content.ptr,local_d8.left.content.size_,1);
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  iVar6 = (**(local_90->super_FsNode)._vptr_FsNode)();
  path.parts.ptr._4_4_ = extraout_var;
  path.parts.ptr._0_4_ = iVar6;
  name_00.content.size_ = 4;
  name_00.content.ptr = "bar";
  Path::Path((Path *)&local_d8,name_00);
  path.parts.size_ = (size_t)local_d8.left.content.ptr;
  Directory::openFile((Directory *)&local_118,path,(WriteMode)local_d8.left.content.size_);
  text.content.size_ = 9;
  text.content.ptr = "original";
  File::writeAll((File *)local_118.parts.size_,text);
  sVar2 = local_118.parts.size_;
  if ((File *)local_118.parts.size_ != (File *)0x0) {
    local_118.parts.size_ = 0;
    (**(code **)((local_118.parts.ptr)->content).ptr)
              (local_118.parts.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  iVar6 = (**(local_90->super_FsNode)._vptr_FsNode)();
  path_00.parts.ptr._4_4_ = extraout_var_00;
  path_00.parts.ptr._0_4_ = iVar6;
  name_01.content.size_ = 4;
  name_01.content.ptr = "bar";
  Path::Path((Path *)&local_f8,name_01);
  path_00.parts.size_ = (size_t)local_f8.content.ptr;
  ReadableDirectory::openFile((ReadableDirectory *)&local_88,path_00);
  ReadableFile::readAllText(&local_138,(ReadableFile *)local_88.parts.size_);
  local_118.parts.ptr = (String *)local_138.content.ptr;
  local_118.parts.size_ = local_138.content.size_;
  local_118.parts.disposer = local_138.content.disposer;
  local_138.content.ptr = (char *)0x0;
  local_138.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&local_d8,(DebugExpression<kj::String> *)&local_118,(char (*) [9])"original");
  sVar2 = local_118.parts.size_;
  pSVar7 = local_118.parts.ptr;
  if (local_118.parts.ptr != (String *)0x0) {
    local_118.parts.ptr = (String *)0x0;
    local_118.parts.size_ = 0;
    (**(local_118.parts.disposer)->_vptr_ArrayDisposer)
              (local_118.parts.disposer,pSVar7,1,sVar2,sVar2,0);
  }
  sVar2 = local_138.content.size_;
  pcVar1 = local_138.content.ptr;
  if (local_138.content.ptr != (char *)0x0) {
    local_138.content.ptr = (char *)0x0;
    local_138.content.size_ = 0;
    (**(local_138.content.disposer)->_vptr_ArrayDisposer)
              (local_138.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_88.parts.size_;
  if ((ReadableFile *)local_88.parts.size_ != (ReadableFile *)0x0) {
    local_88.parts.size_ = 0;
    (**(code **)((local_88.parts.ptr)->content).ptr)
              (local_88.parts.ptr,((FsNode *)sVar2)->_vptr_FsNode[-2] + (long)(FsNode *)sVar2);
  }
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if (local_f8.content.ptr != (char *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_d8.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[84],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2fa,ERROR,
               "\"failed: expected \" \"replacer->get().openFile(Path(\\\"bar\\\"))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [84])
                "failed: expected replacer->get().openFile(Path(\"bar\"))->readAllText() == \"original\""
               ,&local_d8);
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_68.filename.content.size_;
  local_d8.left.content.ptr = "foo";
  local_d8.left.content.size_ = 4;
  local_d8.left.content.disposer = (ArrayDisposer *)0x4b858f;
  local_d8.right = (char (*) [9])&DAT_00000004;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)&local_d8;
  Path::Path(&local_118,parts);
  bVar4 = (**(code **)(((Array<char> *)sVar2)->ptr + 0x40))
                    (sVar2,local_118.parts.ptr,local_118.parts.size_);
  sVar2 = local_118.parts.size_;
  pSVar7 = local_118.parts.ptr;
  local_138.content.ptr = (char *)(CONCAT71(local_138.content.ptr._1_7_,bVar4) ^ 1);
  bVar4 = bVar4 ^ 1;
  if (local_118.parts.ptr != (String *)0x0) {
    local_118.parts.ptr = (String *)0x0;
    local_118.parts.size_ = 0;
    (**(local_118.parts.disposer)->_vptr_ArrayDisposer)
              (local_118.parts.disposer,pSVar7,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
    bVar4 = (byte)local_138.content.ptr;
  }
  if (((bVar4 & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2fb,ERROR,
               "\"failed: expected \" \"!dir->exists(Path({\\\"foo\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [52])"failed: expected !dir->exists(Path({\"foo\", \"bar\"}))",
               (DebugExpression<bool> *)&local_138);
  }
  pRVar3 = local_90;
  iVar6 = (*(local_90->super_FsNode)._vptr_FsNode[1])(local_90);
  if ((char)iVar6 == '\0') {
    Directory::commitFailed(*(WriteMode *)&pRVar3[1].super_FsNode._vptr_FsNode);
  }
  iVar6 = (**(local_90->super_FsNode)._vptr_FsNode)();
  path_01.parts.ptr._4_4_ = extraout_var_01;
  path_01.parts.ptr._0_4_ = iVar6;
  name_02.content.size_ = 4;
  name_02.content.ptr = "bar";
  Path::Path((Path *)&local_f8,name_02);
  path_01.parts.size_ = (size_t)local_f8.content.ptr;
  ReadableDirectory::openFile((ReadableDirectory *)&local_88,path_01);
  ReadableFile::readAllText(&local_138,(ReadableFile *)local_88.parts.size_);
  local_118.parts.ptr = (String *)local_138.content.ptr;
  local_118.parts.size_ = local_138.content.size_;
  local_118.parts.disposer = local_138.content.disposer;
  local_138.content.ptr = (char *)0x0;
  local_138.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&local_d8,(DebugExpression<kj::String> *)&local_118,(char (*) [9])"original");
  sVar2 = local_118.parts.size_;
  pSVar7 = local_118.parts.ptr;
  if (local_118.parts.ptr != (String *)0x0) {
    local_118.parts.ptr = (String *)0x0;
    local_118.parts.size_ = 0;
    (**(local_118.parts.disposer)->_vptr_ArrayDisposer)
              (local_118.parts.disposer,pSVar7,1,sVar2,sVar2,0);
  }
  sVar2 = local_138.content.size_;
  pcVar1 = local_138.content.ptr;
  if (local_138.content.ptr != (char *)0x0) {
    local_138.content.ptr = (char *)0x0;
    local_138.content.size_ = 0;
    (**(local_138.content.disposer)->_vptr_ArrayDisposer)
              (local_138.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_88.parts.size_;
  if ((ReadableFile *)local_88.parts.size_ != (ReadableFile *)0x0) {
    local_88.parts.size_ = 0;
    (**(code **)((local_88.parts.ptr)->content).ptr)
              (local_88.parts.ptr,((FsNode *)sVar2)->_vptr_FsNode[-2] + (long)(FsNode *)sVar2);
  }
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if (local_f8.content.ptr != (char *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_d8.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[84],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2fe,ERROR,
               "\"failed: expected \" \"replacer->get().openFile(Path(\\\"bar\\\"))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [84])
                "failed: expected replacer->get().openFile(Path(\"bar\"))->readAllText() == \"original\""
               ,&local_d8);
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_68.filename.content.size_;
  local_118.parts.ptr = (String *)0x4d8ac4;
  local_118.parts.size_ = (size_t)&DAT_00000004;
  local_118.parts.disposer = (ArrayDisposer *)0x4b858f;
  local_100 = 4;
  parts_00.size_ = 2;
  parts_00.ptr = (StringPtr *)&local_118;
  Path::Path(&local_88,parts_00);
  path_02.parts.size_ = (size_t)local_88.parts.ptr;
  path_02.parts.ptr = (String *)sVar2;
  ReadableDirectory::openFile((ReadableDirectory *)&local_68.filename.content.disposer,path_02);
  ReadableFile::readAllText(&local_f8,local_50);
  local_138.content.ptr = local_f8.content.ptr;
  local_138.content.size_ = local_f8.content.size_;
  local_138.content.disposer = local_f8.content.disposer;
  local_f8.content.ptr = (char *)0x0;
  local_f8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&local_d8,(DebugExpression<kj::String> *)&local_138,(char (*) [9])"original");
  sVar2 = local_138.content.size_;
  pcVar1 = local_138.content.ptr;
  if (local_138.content.ptr != (char *)0x0) {
    local_138.content.ptr = (char *)0x0;
    local_138.content.size_ = 0;
    (**(local_138.content.disposer)->_vptr_ArrayDisposer)
              (local_138.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if (local_f8.content.ptr != (char *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar3 = local_50;
  if (local_50 != (ReadableFile *)0x0) {
    local_50 = (ReadableFile *)0x0;
    (**(local_68.filename.content.disposer)->_vptr_ArrayDisposer)
              (local_68.filename.content.disposer,
               (pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  sVar2 = local_88.parts.size_;
  pSVar7 = local_88.parts.ptr;
  if (local_88.parts.ptr != (String *)0x0) {
    local_88.parts.ptr = (String *)0x0;
    local_88.parts.size_ = 0;
    (**(local_88.parts.disposer)->_vptr_ArrayDisposer)
              (local_88.parts.disposer,pSVar7,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_d8.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2ff,ERROR,
               "\"failed: expected \" \"dir->openFile(Path({\\\"foo\\\", \\\"bar\\\"}))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [82])
                "failed: expected dir->openFile(Path({\"foo\", \"bar\"}))->readAllText() == \"original\""
               ,&local_d8);
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar3 = local_90;
  if (local_90 != (ReadableFile *)0x0) {
    local_90 = (ReadableFile *)0x0;
    (**(code **)*local_98._vptr_FsNode)
              (local_98._vptr_FsNode,
               (pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  sVar2 = local_68.filename.content.size_;
  name_03.content.size_ = 4;
  name_03.content.ptr = "foo";
  Path::Path((Path *)&local_d8,name_03);
  (**(code **)(((Array<char> *)sVar2)->ptr + 0x90))
            (&local_138,sVar2,local_d8.left.content.ptr,local_d8.left.content.size_,1);
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pSVar7 = (String *)(*(code *)**(undefined8 **)local_138.content.size_)();
  name_04.content.size_ = 6;
  name_04.content.ptr = "corge";
  Path::Path((Path *)&local_d8,name_04);
  path_03.parts.size_ = (size_t)local_d8.left.content.ptr;
  path_03.parts.ptr = pSVar7;
  Directory::openFile((Directory *)&local_118,path_03,(WriteMode)local_d8.left.content.size_);
  text_00.content.size_ = 7;
  text_00.content.ptr = "bazqux";
  File::writeAll((File *)local_118.parts.size_,text_00);
  sVar2 = local_118.parts.size_;
  if ((File *)local_118.parts.size_ != (File *)0x0) {
    local_118.parts.size_ = 0;
    (**(code **)((local_118.parts.ptr)->content).ptr)
              (local_118.parts.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  (**(code **)(((Array<char> *)local_68.filename.content.size_)->ptr + 0x30))(&local_d8);
  if (local_d8.left.content.size_ == 1) {
    (**(code **)(((Array<char> *)local_68.filename.content.size_)->ptr + 0x30))(&local_118);
    sVar2 = local_118.parts.size_;
    pSVar7 = local_118.parts.ptr;
    if ((undefined1 *)((local_118.parts.ptr)->content).size_ == &DAT_00000004) {
      bVar8 = *(int *)((local_118.parts.ptr)->content).ptr == 0x6f6f66;
    }
    else {
      bVar8 = false;
    }
    local_118.parts.ptr = (String *)0x0;
    local_118.parts.size_ = 0;
    (**(local_118.parts.disposer)->_vptr_ArrayDisposer)
              (local_118.parts.disposer,pSVar7,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  else {
    bVar8 = false;
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  local_f8.content.ptr = (char *)CONCAT71(local_f8.content.ptr._1_7_,bVar8);
  if (kj::_::Debug::minSeverity < 3 && bVar8 == false) {
    kj::_::Debug::log<char_const(&)[78],bool&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x306,ERROR,
               "\"failed: expected \" \"dir->listNames().size() == 1 && dir->listNames()[0] == \\\"foo\\\"\", _kjCondition"
               ,(char (*) [78])
                "failed: expected dir->listNames().size() == 1 && dir->listNames()[0] == \"foo\"",
               (bool *)&local_f8);
  }
  bVar4 = (**(code **)(*(long *)local_138.content.size_ + 8))();
  local_d8.left.content.ptr = (char *)(CONCAT71(local_d8.left.content.ptr._1_7_,bVar4) ^ 1);
  if ((bVar4 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x307,ERROR,"\"failed: expected \" \"!replacer->tryCommit()\", _kjCondition",
               (char (*) [40])"failed: expected !replacer->tryCommit()",
               (DebugExpression<bool> *)&local_d8);
  }
  sVar2 = local_138.content.size_;
  if ((long *)local_138.content.size_ != (long *)0x0) {
    local_138.content.size_ = 0;
    (*(code *)**(undefined8 **)local_138.content.ptr)
              (local_138.content.ptr,sVar2 + *(long *)(*(long *)sVar2 + -0x10));
  }
  sVar2 = local_68.filename.content.size_;
  local_118.parts.ptr = (String *)0x4d8ac4;
  local_118.parts.size_ = (size_t)&DAT_00000004;
  local_118.parts.disposer = (ArrayDisposer *)0x4b858f;
  local_100 = 4;
  parts_01.size_ = 2;
  parts_01.ptr = (StringPtr *)&local_118;
  Path::Path(&local_88,parts_01);
  path_04.parts.size_ = (size_t)local_88.parts.ptr;
  path_04.parts.ptr = (String *)sVar2;
  ReadableDirectory::openFile((ReadableDirectory *)&local_98,path_04);
  ReadableFile::readAllText(&local_f8,local_90);
  local_138.content.ptr = local_f8.content.ptr;
  local_138.content.size_ = local_f8.content.size_;
  local_138.content.disposer = local_f8.content.disposer;
  local_f8.content.ptr = (char *)0x0;
  local_f8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&local_d8,(DebugExpression<kj::String> *)&local_138,(char (*) [9])"original");
  sVar2 = local_138.content.size_;
  pcVar1 = local_138.content.ptr;
  if (local_138.content.ptr != (char *)0x0) {
    local_138.content.ptr = (char *)0x0;
    local_138.content.size_ = 0;
    (**(local_138.content.disposer)->_vptr_ArrayDisposer)
              (local_138.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if (local_f8.content.ptr != (char *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar3 = local_90;
  if (local_90 != (ReadableFile *)0x0) {
    local_90 = (ReadableFile *)0x0;
    (**(code **)*local_98._vptr_FsNode)
              (local_98._vptr_FsNode,
               (pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  sVar2 = local_88.parts.size_;
  pSVar7 = local_88.parts.ptr;
  if (local_88.parts.ptr != (String *)0x0) {
    local_88.parts.ptr = (String *)0x0;
    local_88.parts.size_ = 0;
    (**(local_88.parts.disposer)->_vptr_ArrayDisposer)
              (local_88.parts.disposer,pSVar7,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_d8.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x30b,ERROR,
               "\"failed: expected \" \"dir->openFile(Path({\\\"foo\\\", \\\"bar\\\"}))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [82])
                "failed: expected dir->openFile(Path({\"foo\", \"bar\"}))->readAllText() == \"original\""
               ,&local_d8);
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_68.filename.content.size_;
  local_d8.left.content.ptr = "foo";
  local_d8.left.content.size_ = 4;
  local_d8.left.content.disposer = (ArrayDisposer *)0x4b8665;
  local_d8.right = (char (*) [9])&DAT_00000006;
  parts_02.size_ = 2;
  parts_02.ptr = (StringPtr *)&local_d8;
  Path::Path(&local_118,parts_02);
  bVar4 = (**(code **)(((Array<char> *)sVar2)->ptr + 0x40))
                    (sVar2,local_118.parts.ptr,local_118.parts.size_);
  sVar2 = local_118.parts.size_;
  pSVar7 = local_118.parts.ptr;
  local_138.content.ptr = (char *)(CONCAT71(local_138.content.ptr._1_7_,bVar4) ^ 1);
  bVar4 = bVar4 ^ 1;
  if (local_118.parts.ptr != (String *)0x0) {
    local_118.parts.ptr = (String *)0x0;
    local_118.parts.size_ = 0;
    (**(local_118.parts.disposer)->_vptr_ArrayDisposer)
              (local_118.parts.disposer,pSVar7,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
    bVar4 = (byte)local_138.content.ptr;
  }
  if (((bVar4 & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[54],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x30c,ERROR,
               "\"failed: expected \" \"!dir->exists(Path({\\\"foo\\\", \\\"corge\\\"}))\", _kjCondition"
               ,(char (*) [54])"failed: expected !dir->exists(Path({\"foo\", \"corge\"}))",
               (DebugExpression<bool> *)&local_138);
  }
  sVar2 = local_68.filename.content.size_;
  name_05.content.size_ = 4;
  name_05.content.ptr = "foo";
  Path::Path((Path *)&local_d8,name_05);
  (**(code **)(((Array<char> *)sVar2)->ptr + 0x90))
            (&local_138,sVar2,local_d8.left.content.ptr,local_d8.left.content.size_,2);
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pSVar7 = (String *)(*(code *)**(undefined8 **)local_138.content.size_)();
  name_06.content.size_ = 6;
  name_06.content.ptr = "corge";
  Path::Path((Path *)&local_d8,name_06);
  path_05.parts.size_ = (size_t)local_d8.left.content.ptr;
  path_05.parts.ptr = pSVar7;
  Directory::openFile((Directory *)&local_118,path_05,(WriteMode)local_d8.left.content.size_);
  text_01.content.size_ = 7;
  text_01.content.ptr = "bazqux";
  File::writeAll((File *)local_118.parts.size_,text_01);
  sVar2 = local_118.parts.size_;
  if ((File *)local_118.parts.size_ != (File *)0x0) {
    local_118.parts.size_ = 0;
    (**(code **)((local_118.parts.ptr)->content).ptr)
              (local_118.parts.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  (**(code **)(((Array<char> *)local_68.filename.content.size_)->ptr + 0x30))(&local_d8);
  if (local_d8.left.content.size_ == 1) {
    (**(code **)(((Array<char> *)local_68.filename.content.size_)->ptr + 0x30))(&local_118);
    sVar2 = local_118.parts.size_;
    pSVar7 = local_118.parts.ptr;
    if ((undefined1 *)((local_118.parts.ptr)->content).size_ == &DAT_00000004) {
      bVar8 = *(int *)((local_118.parts.ptr)->content).ptr == 0x6f6f66;
    }
    else {
      bVar8 = false;
    }
    local_118.parts.ptr = (String *)0x0;
    local_118.parts.size_ = 0;
    (**(local_118.parts.disposer)->_vptr_ArrayDisposer)
              (local_118.parts.disposer,pSVar7,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  else {
    bVar8 = false;
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  local_f8.content.ptr = (char *)CONCAT71(local_f8.content.ptr._1_7_,bVar8);
  if (kj::_::Debug::minSeverity < 3 && bVar8 == false) {
    kj::_::Debug::log<char_const(&)[78],bool&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x312,ERROR,
               "\"failed: expected \" \"dir->listNames().size() == 1 && dir->listNames()[0] == \\\"foo\\\"\", _kjCondition"
               ,(char (*) [78])
                "failed: expected dir->listNames().size() == 1 && dir->listNames()[0] == \"foo\"",
               (bool *)&local_f8);
  }
  sVar2 = local_138.content.size_;
  cVar5 = (**(code **)(*(long *)local_138.content.size_ + 8))(local_138.content.size_);
  if (cVar5 == '\0') {
    Directory::commitFailed(*(WriteMode *)(sVar2 + 8));
  }
  sVar2 = local_138.content.size_;
  if ((long *)local_138.content.size_ != (long *)0x0) {
    local_138.content.size_ = 0;
    (*(code *)**(undefined8 **)local_138.content.ptr)
              (local_138.content.ptr,sVar2 + *(long *)(*(long *)sVar2 + -0x10));
  }
  sVar2 = local_68.filename.content.size_;
  local_d8.left.content.ptr = "foo";
  local_d8.left.content.size_ = 4;
  local_d8.left.content.disposer = (ArrayDisposer *)0x4b858f;
  local_d8.right = (char (*) [9])&DAT_00000004;
  parts_03.size_ = 2;
  parts_03.ptr = (StringPtr *)&local_d8;
  Path::Path(&local_118,parts_03);
  bVar4 = (**(code **)(((Array<char> *)sVar2)->ptr + 0x40))
                    (sVar2,local_118.parts.ptr,local_118.parts.size_);
  sVar2 = local_118.parts.size_;
  pSVar7 = local_118.parts.ptr;
  local_138.content.ptr = (char *)(CONCAT71(local_138.content.ptr._1_7_,bVar4) ^ 1);
  bVar4 = bVar4 ^ 1;
  if (local_118.parts.ptr != (String *)0x0) {
    local_118.parts.ptr = (String *)0x0;
    local_118.parts.size_ = 0;
    (**(local_118.parts.disposer)->_vptr_ArrayDisposer)
              (local_118.parts.disposer,pSVar7,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
    bVar4 = (byte)local_138.content.ptr;
  }
  if (((bVar4 & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x317,ERROR,
               "\"failed: expected \" \"!dir->exists(Path({\\\"foo\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [52])"failed: expected !dir->exists(Path({\"foo\", \"bar\"}))",
               (DebugExpression<bool> *)&local_138);
  }
  sVar2 = local_68.filename.content.size_;
  local_118.parts.ptr = (String *)0x4d8ac4;
  local_118.parts.size_ = 4;
  local_118.parts.disposer = (ArrayDisposer *)0x4b8665;
  local_100 = 6;
  parts_04.size_ = 2;
  parts_04.ptr = (StringPtr *)&local_118;
  Path::Path(&local_88,parts_04);
  path_06.parts.size_ = (size_t)local_88.parts.ptr;
  path_06.parts.ptr = (String *)sVar2;
  ReadableDirectory::openFile((ReadableDirectory *)&local_98,path_06);
  ReadableFile::readAllText(&local_f8,local_90);
  local_138.content.ptr = local_f8.content.ptr;
  local_138.content.size_ = local_f8.content.size_;
  local_138.content.disposer = local_f8.content.disposer;
  local_f8.content.ptr = (char *)0x0;
  local_f8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[7]> *)&local_d8,
             (DebugExpression<kj::String> *)&local_138,(char (*) [7])"bazqux");
  sVar2 = local_138.content.size_;
  pcVar1 = local_138.content.ptr;
  if (local_138.content.ptr != (char *)0x0) {
    local_138.content.ptr = (char *)0x0;
    local_138.content.size_ = 0;
    (**(local_138.content.disposer)->_vptr_ArrayDisposer)
              (local_138.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if (local_f8.content.ptr != (char *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar3 = local_90;
  if (local_90 != (ReadableFile *)0x0) {
    local_90 = (ReadableFile *)0x0;
    (**(code **)*local_98._vptr_FsNode)
              (local_98._vptr_FsNode,
               (pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  sVar2 = local_88.parts.size_;
  pSVar7 = local_88.parts.ptr;
  if (local_88.parts.ptr != (String *)0x0) {
    local_88.parts.ptr = (String *)0x0;
    local_88.parts.size_ = 0;
    (**(local_88.parts.disposer)->_vptr_ArrayDisposer)
              (local_88.parts.disposer,pSVar7,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_d8.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x318,ERROR,
               "\"failed: expected \" \"dir->openFile(Path({\\\"foo\\\", \\\"corge\\\"}))->readAllText() == \\\"bazqux\\\"\", _kjCondition"
               ,(char (*) [82])
                "failed: expected dir->openFile(Path({\"foo\", \"corge\"}))->readAllText() == \"bazqux\""
               ,(DebugComparison<kj::String,_const_char_(&)[7]> *)&local_d8);
  }
  sVar2 = local_d8.left.content.size_;
  pcVar1 = local_d8.left.content.ptr;
  if (local_d8.left.content.ptr != (char *)0x0) {
    local_d8.left.content.ptr = (char *)0x0;
    local_d8.left.content.size_ = 0;
    (**(local_d8.left.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_68.filename.content.size_;
  if ((String *)local_68.filename.content.size_ != (String *)0x0) {
    local_68.filename.content.size_ = 0;
    (*(code *)**(undefined8 **)local_68.filename.content.ptr)
              (local_68.filename.content.ptr,
               (long)&((Array<char> *)sVar2)->ptr + *(long *)(((Array<char> *)sVar2)->ptr + -0x10));
  }
  TempDir::~TempDir(&local_48);
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }